

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS580314BA.h
# Opt level: O2

int InitMS580314BA(MS580314BA *pMS580314BA)

{
  int iVar1;
  undefined8 in_RAX;
  undefined5 local_8;
  undefined3 uStack_3;
  
  _local_8 = CONCAT35((int3)((ulong)in_RAX >> 0x28),0x190020025a);
  iVar1 = WriteAllRS232Port(&pMS580314BA->RS232Port,(uint8 *)&local_8,5);
  if (iVar1 == 0) {
    mSleep(10);
  }
  else {
    puts("Error writing data to a MS580314BA. ");
  }
  return (uint)(iVar1 != 0);
}

Assistant:

inline int InitMS580314BA(MS580314BA* pMS580314BA)
{
	uint8 writebuf[5];
	
	// Sequence for I2c and serial communication
	writebuf[0] = (uint8)0x5A; // start configuration
	writebuf[1] = (uint8)0x02; // iss mode
	writebuf[2] = (uint8)0x20; // I2C_S_20KHZ
	writebuf[3] = (uint8)0x00; // (115200)
	writebuf[4] = (uint8)0x19; // Baudrate

	if (WriteAllRS232Port(&pMS580314BA->RS232Port, writebuf, 5) != EXIT_SUCCESS)
	{ 
		printf("Error writing data to a MS580314BA. \n");
		return EXIT_FAILURE;
	}
	
	mSleep(10);

	return EXIT_SUCCESS;
}